

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unixAccess(unqlite_vfs *NotUsed,char *zPath,int flags,int *pResOut)

{
  int iVar1;
  int __type;
  stat buf;
  stat sStack_a8;
  
  iVar1 = 6;
  if (flags != 1) {
    iVar1 = 0;
  }
  __type = 4;
  if (flags != 2) {
    __type = iVar1;
  }
  iVar1 = access(zPath,__type);
  *pResOut = (uint)(iVar1 == 0);
  if (iVar1 == 0 && flags == 0) {
    iVar1 = stat(zPath,&sStack_a8);
    if ((iVar1 == 0) && (sStack_a8.st_size == 0)) {
      *pResOut = 0;
    }
  }
  return 0;
}

Assistant:

static int unixAccess(
  unqlite_vfs *NotUsed,   /* The VFS containing this xAccess method */
  const char *zPath,      /* Path of the file to examine */
  int flags,              /* What do we want to learn about the zPath file? */
  int *pResOut            /* Write result boolean here */
){
  int amode = 0;
  SXUNUSED(NotUsed);
  switch( flags ){
    case UNQLITE_ACCESS_EXISTS:
      amode = F_OK;
      break;
    case UNQLITE_ACCESS_READWRITE:
      amode = W_OK|R_OK;
      break;
    case UNQLITE_ACCESS_READ:
      amode = R_OK;
      break;
    default:
		/* Can't happen */
      break;
  }
  *pResOut = (access(zPath, amode)==0);
  if( flags==UNQLITE_ACCESS_EXISTS && *pResOut ){
    struct stat buf;
    if( 0==stat(zPath, &buf) && buf.st_size==0 ){
      *pResOut = 0;
    }
  }
  return UNQLITE_OK;
}